

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O0

int Lodtalk::SmallInteger::stAsFloat(InterpreterProxy *interpreter)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  SmallIntegerValue SVar3;
  SmallIntegerValue ia;
  Oop v;
  InterpreterProxy *interpreter_local;
  
  v.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)interpreter;
  iVar2 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    ia = (**(code **)(*(long *)v.field_0 + 0x58))();
    bVar1 = Oop::isSmallInteger((Oop *)&ia);
    if (bVar1) {
      SVar3 = Oop::decodeSmallInteger((Oop *)&ia);
      interpreter_local._4_4_ = (**(code **)(*(long *)v.field_0 + 0xa0))((double)SVar3);
    }
    else {
      interpreter_local._4_4_ = (**(code **)(*(long *)v.field_0 + 0xf0))();
    }
  }
  else {
    interpreter_local._4_4_ = (**(code **)(*(long *)v.field_0 + 0xf0))();
  }
  return interpreter_local._4_4_;
}

Assistant:

int SmallInteger::stAsFloat(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 0)
        return interpreter->primitiveFailed();

    auto v = interpreter->getReceiver();
    if (!v.isSmallInteger())
        return interpreter->primitiveFailed();

    auto ia = v.decodeSmallInteger();
    return interpreter->returnFloat((double)ia);
}